

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver-c.cc
# Opt level: O1

void NLW2_DestroyNLSolver_C(NLW2_NLSolver_C *pnls)

{
  void *pvVar1;
  void *pvVar2;
  NLSolver *this;
  
  pvVar1 = pnls->p_sol_;
  if (pvVar1 != (void *)0x0) {
    pvVar2 = *(void **)((long)pvVar1 + 0x90);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)pvVar1 + 0xa0) - (long)pvVar2);
    }
    std::
    _Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
    ::~_Rb_tree((_Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
                 *)((long)pvVar1 + 0x60));
    pvVar2 = *(void **)((long)pvVar1 + 0x48);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)pvVar1 + 0x58) - (long)pvVar2);
    }
    pvVar2 = *(void **)((long)pvVar1 + 0x30);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)pvVar1 + 0x40) - (long)pvVar2);
    }
    if (*(long **)((long)pvVar1 + 8) != (long *)((long)pvVar1 + 0x18)) {
      operator_delete(*(long **)((long)pvVar1 + 8),*(long *)((long)pvVar1 + 0x18) + 1);
    }
    operator_delete(pvVar1,0xa8);
    pnls->p_sol_ = (void *)0x0;
  }
  this = (NLSolver *)pnls->p_nlsol_;
  if (this != (NLSolver *)0x0) {
    mp::NLSolver::~NLSolver(this);
    operator_delete(this,200);
  }
  pnls->p_nlsol_ = (void *)0x0;
  if ((long *)pnls->p_utl_ != (long *)0x0) {
    (**(code **)(*pnls->p_utl_ + 8))();
    pnls->p_utl_ = (void *)0x0;
  }
  return;
}

Assistant:

void NLW2_DestroyNLSolver_C(NLW2_NLSolver_C* pnls) {
  if (pnls->p_sol_) {
    delete (mp::NLW2_Solution_C_Data*)pnls->p_sol_;
    pnls->p_sol_ = nullptr;
  }
  delete (mp::NLSOL_C_Impl*)(pnls->p_nlsol_);
  pnls->p_nlsol_ = nullptr;
  if (pnls->p_utl_) {
    delete (mp::NLUtils_C_Impl*)(pnls->p_utl_);
    pnls->p_utl_ = nullptr;
  }
}